

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O0

CharInfo __thiscall
MeCab::CharProperty::getCharInfo(CharProperty *this,char *begin,char *end,size_t *mblen)

{
  size_t *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  unsigned_short t;
  char *in_stack_ffffffffffffffb8;
  ushort local_2a;
  
  switch(*(undefined4 *)(in_RDI + 0x38)) {
  case 2:
    local_2a = utf8_to_ucs2(in_RSI,in_RDX,in_RCX);
    break;
  case 3:
    local_2a = utf16_to_ucs2(in_RDI,in_stack_ffffffffffffffb8,(size_t *)0x13c913);
    break;
  case 4:
    local_2a = utf16le_to_ucs2(in_RSI,in_RDX,in_RCX);
    break;
  case 5:
    local_2a = utf16be_to_ucs2(in_RSI,in_RDX,in_RCX);
    break;
  default:
    local_2a = utf8_to_ucs2(in_RSI,in_RDX,in_RCX);
  }
  return *(CharInfo *)(*(long *)(in_RDI + 0x30) + (ulong)local_2a * 4);
}

Assistant:

inline CharInfo getCharInfo(const char *begin,
                              const char *end,
                              size_t *mblen) const {
    unsigned short int t = 0;
#ifndef MECAB_USE_UTF8_ONLY
    switch (charset_) {
      case EUC_JP:  t = euc_to_ucs2(begin, end, mblen); break;
      case CP932:   t = cp932_to_ucs2(begin, end, mblen); break;
      case UTF8:    t = utf8_to_ucs2(begin, end, mblen); break;
      case UTF16:   t = utf16_to_ucs2(begin, end, mblen); break;
      case UTF16LE: t = utf16le_to_ucs2(begin, end, mblen); break;
      case UTF16BE: t = utf16be_to_ucs2(begin, end, mblen); break;
      case ASCII:   t = ascii_to_ucs2(begin, end, mblen); break;
      default:      t = utf8_to_ucs2(begin, end, mblen); break;
    }
#else
    switch (charset_) {
      case UTF8:    t = utf8_to_ucs2(begin, end, mblen); break;
      case UTF16:   t = utf16_to_ucs2(begin, end, mblen); break;
      case UTF16LE: t = utf16le_to_ucs2(begin, end, mblen); break;
      case UTF16BE: t = utf16be_to_ucs2(begin, end, mblen); break;
      default:      t = utf8_to_ucs2(begin, end, mblen); break;
    }
#endif
    return map_[t];
  }